

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions::
     MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Nullable<const_char_*> failure_msg;
  TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions *_this;
  TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<edition_unittest::TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions_const*,edition_unittest::TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions*>
                          ((TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions
                            **)local_18,&local_20,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
               ,0x39ee,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18)
    ;
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      *(int *)((long)&local_20->field_0 + 8) = (int)from_msg[1]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 2) != 0) {
      (local_20->field_0)._impl_.b_ = *(int32_t *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4);
    }
  }
  (local_20->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_20->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_20->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions*>(&to_msg);
  auto& from = static_cast<const TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestChildExtensionData.NestedTestAllExtensionsData.NestedDynamicExtensions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.a_ = from._impl_.a_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.b_ = from._impl_.b_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}